

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O1

void __thiscall BaseNode::RenderSlot(BaseNode *this,char *slot_title,int kind)

{
  ImVec2 *pIVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  bool bVar5;
  ImU32 col;
  ImGuiID id;
  ImGuiStyle *pIVar6;
  ImDrawList *this_00;
  uint uVar7;
  float fVar8;
  float fVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar10;
  float fVar11;
  ImColor color;
  ImRect circle_rect;
  float local_98;
  float fStack_94;
  ImVec2 local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  ImRect local_40;
  
  pIVar6 = ImGui::GetStyle();
  fVar8 = gCanvas->zoom;
  IVar3 = ImGui::CalcTextSize(slot_title,(char *)0x0,false,-1.0);
  fVar10 = (pIVar6->ItemSpacing).x * gCanvas->zoom;
  local_68._8_4_ = extraout_XMM0_Dc;
  local_68._0_4_ = IVar3.x;
  local_68._4_4_ = IVar3.y;
  local_68._12_4_ = extraout_XMM0_Dd;
  if (kind < 1) {
    fVar10 = -fVar10;
  }
  IVar3 = ImGui::GetCursorScreenPos();
  local_58._4_4_ = IVar3.y + 0.0;
  local_58._0_4_ = fVar10 + IVar3.x;
  ImGui::SetCursorScreenPos((ImVec2 *)local_58);
  bVar5 = ImNodes::BeginSlot(slot_title,kind);
  if (bVar5) {
    this_00 = ImGui::GetWindowDrawList();
    uVar7 = 5;
    bVar5 = ImNodes::IsSlotCurveHovered();
    if (!bVar5) {
      uVar7 = 4;
      bVar5 = ImNodes::IsConnectingCompatibleSlot();
      if (bVar5) {
        bVar5 = IsAlreadyConnectedWithPendingConnection(this,slot_title,kind);
        uVar7 = bVar5 ^ 5;
      }
    }
    fVar8 = fVar8 * 5.0;
    pIVar1 = (ImVec2 *)((long)&gCanvas->colors[0].Value.x + (ulong)(uVar7 << 4));
    local_58._0_8_ = *pIVar1;
    local_58._8_8_ = pIVar1[1];
    ImGui::PushStyleColor(0,(ImVec4 *)local_58);
    if (0 < kind) {
      uVar7 = -(uint)((float)local_68._0_4_ <= this->output_max_title_width);
      fVar9 = (float)(~uVar7 & local_68._0_4_ | (uint)this->output_max_title_width & uVar7);
      this->output_max_title_width = fVar9;
      fVar11 = (fVar9 + (pIVar6->ItemSpacing).x) - (float)local_68._0_4_;
      fVar9 = ImGui::GetCursorPosX();
      ImGui::SetCursorPosX(fVar9 + fVar11);
      ImGui::TextUnformatted(slot_title,(char *)0x0);
      ImGui::SameLine(0.0,-1.0);
    }
    IVar3 = ImGui::GetCursorScreenPos();
    IVar4 = ImGui::GetCursorScreenPos();
    local_40.Max.x = fVar8 + fVar8 + IVar4.x;
    local_98 = IVar3.x;
    fStack_94 = IVar3.y;
    local_40.Min.x = local_98;
    local_40.Max.y = (float)local_68._4_4_ * 0.5 - fVar8;
    local_40.Min.y = fStack_94 + local_40.Max.y;
    local_40.Max.y = local_40.Max.y + IVar4.y + fVar8 + fVar8;
    local_70.x = (local_98 + local_40.Max.x) * 0.5;
    local_70.y = (local_40.Max.y + local_40.Min.y) * 0.5;
    col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_58);
    ImDrawList::AddCircleFilled(this_00,&local_70,fVar8,col,0xc);
    local_70.y = local_40.Max.y - local_40.Min.y;
    local_70.x = local_40.Max.x - local_40.Min.x;
    ImGui::ItemSize(&local_70,0.0);
    id = ImGui::GetID(this->title);
    ImGui::ItemAdd(&local_40,id,(ImRect *)0x0);
    if (kind < 0) {
      ImGui::SameLine(0.0,-1.0);
      ImGui::TextUnformatted(slot_title,(char *)0x0);
    }
    ImGui::PopStyleColor(1);
    ImNodes::EndSlot();
    pIVar2 = GImGui->CurrentWindow;
    pIVar2->WriteAccessed = true;
    (pIVar2->DC).CursorMaxPos.x = (pIVar2->DC).CursorMaxPos.x - fVar10;
  }
  return;
}

Assistant:

void RenderSlot(const char* slot_title, int kind)
    {
        const auto& style = ImGui::GetStyle();
        const float CIRCLE_RADIUS = 5.f * gCanvas->zoom;
        ImVec2 title_size = ImGui::CalcTextSize(slot_title);
        // Pull entire slot a little bit out of the edge so that curves connect into int without visible seams
        float item_offset_x = style.ItemSpacing.x * gCanvas->zoom;
        if (!ImNodes::IsOutputSlotKind(kind))
            item_offset_x = -item_offset_x;
        ImGui::SetCursorScreenPos(ImGui::GetCursorScreenPos() + ImVec2{item_offset_x, 0});

        if (ImNodes::BeginSlot(slot_title, kind))
        {
            auto* draw_lists = ImGui::GetWindowDrawList();

            // Slot appearance can be altered depending on curve hovering state.
            bool is_active = ImNodes::IsSlotCurveHovered() ||
                (ImNodes::IsConnectingCompatibleSlot() && !IsAlreadyConnectedWithPendingConnection(slot_title, kind));

            ImColor color = gCanvas->colors[is_active ? ImNodes::ColConnectionActive : ImNodes::ColConnection];

            ImGui::PushStyleColor(ImGuiCol_Text, color.Value);

            if (ImNodes::IsOutputSlotKind(kind))
            {
                // Align output slots to the right edge of the node.
                output_max_title_width = ImMax(output_max_title_width, title_size.x);
                float offset = (output_max_title_width + style.ItemSpacing.x) - title_size.x;
                ImGui::SetCursorPosX(ImGui::GetCursorPosX() + offset);

                ImGui::TextUnformatted(slot_title);
                ImGui::SameLine();
            }

            ImRect circle_rect{
                ImGui::GetCursorScreenPos(),
                ImGui::GetCursorScreenPos() + ImVec2{CIRCLE_RADIUS * 2, CIRCLE_RADIUS * 2}
            };
            // Vertical-align circle in the middle of the line.
            float circle_offset_y = title_size.y / 2.f - CIRCLE_RADIUS;
            circle_rect.Min.y += circle_offset_y;
            circle_rect.Max.y += circle_offset_y;
            draw_lists->AddCircleFilled(circle_rect.GetCenter(), CIRCLE_RADIUS, color);

            ImGui::ItemSize(circle_rect.GetSize());
            ImGui::ItemAdd(circle_rect, ImGui::GetID(title));

            if (ImNodes::IsInputSlotKind(kind))
            {
                ImGui::SameLine();
                ImGui::TextUnformatted(slot_title);
            }

            ImGui::PopStyleColor();
            ImNodes::EndSlot();

            // A dirty trick to place output slot circle on the border.
            ImGui::GetCurrentWindow()->DC.CursorMaxPos.x -= item_offset_x;
        }
    }